

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_conv_2d_dw(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,int s0,int s1,int p0,int p1,int d0,
               int d1)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *b_00;
  
  pgVar1 = ggml_reshape_4d(ctx,a,a->ne[0],a->ne[1],1,a->ne[3] * a->ne[2]);
  pgVar2 = ggml_reshape_4d(ctx,b,b->ne[0],b->ne[1],1,b->ne[3] * b->ne[2]);
  pgVar2 = ggml_im2col(ctx,pgVar1,pgVar2,s0,s1,p0,p1,d0,d1,true,GGML_TYPE_F16);
  b_00 = ggml_reshape_4d(ctx,pgVar2,pgVar2->ne[0],pgVar2->ne[1] * pgVar2->ne[2],b->ne[2],b->ne[3]);
  pgVar1 = ggml_reshape_4d(ctx,pgVar1,pgVar1->ne[1] * pgVar1->ne[0],pgVar1->ne[2],pgVar1->ne[3],1);
  pgVar1 = ggml_mul_mat(ctx,pgVar1,b_00);
  pgVar1 = ggml_reshape_4d(ctx,pgVar1,pgVar2->ne[1],pgVar2->ne[2],b->ne[2],b->ne[3]);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_conv_2d_dw(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        int                   s0,
        int                   s1,
        int                   p0,
        int                   p1,
        int                   d0,
        int                   d1) {
    struct ggml_tensor * new_a = ggml_reshape_4d(ctx, a, a->ne[0], a->ne[1], 1, a->ne[2] * a->ne[3]);
    struct ggml_tensor * im2col = ggml_im2col(ctx, new_a,
                                        ggml_reshape_4d(ctx, b, b->ne[0], b->ne[1], 1, b->ne[2] * b->ne[3]),
                                        s0, s1, p0, p1, d0, d1, true, GGML_TYPE_F16); // [N * IC, OH, OW, KH * KW]
    struct ggml_tensor * new_b = ggml_reshape_4d(ctx, im2col, im2col->ne[0], im2col->ne[2] * im2col->ne[1], b->ne[2], b->ne[3]); // [N * IC, OH, OW, KH * KW] => [N, IC, OH * OW, KH * KW]

    new_a = ggml_reshape_4d(ctx, new_a, (new_a->ne[0] * new_a->ne[1]), new_a->ne[2],  new_a->ne[3], 1);                       // [OC，1, KH, KW] => [1, OC, 1, KH * KW]
    struct ggml_tensor * result = ggml_mul_mat(ctx, new_a, new_b);
    result = ggml_reshape_4d(ctx, result, im2col->ne[1], im2col->ne[2], b->ne[2], b->ne[3]); // [N, OC, OH, OW]

    return result;
}